

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

_Bool zt_cstr_abspath(char *path)

{
  int iVar1;
  char *in_RDI;
  int len;
  _Bool local_1;
  
  iVar1 = strncmp(in_RDI,"/",1);
  if (iVar1 == 0) {
LAB_001067f8:
    local_1 = true;
  }
  else {
    if (*in_RDI == '.') {
      iVar1 = strncmp(in_RDI + 1,"/",1);
      if (iVar1 == 0) goto LAB_001067f8;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
zt_cstr_abspath(const char * path) {

    int len = strlen(PATH_SEPERATOR);

    if ((strncmp(path, PATH_SEPERATOR, len) == 0) ||
        (path[0] == '.' && strncmp(&path[1], PATH_SEPERATOR, len) == 0)) {
        return true;
    }

    return false;
}